

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult
testing::internal::
CmpHelperEQFailure<std::shared_ptr<libcellml::AnalyserExternalVariable>,std::shared_ptr<libcellml::AnalyserExternalVariable>>
          (char *lhs_expression,char *rhs_expression,
          shared_ptr<libcellml::AnalyserExternalVariable> *lhs,
          shared_ptr<libcellml::AnalyserExternalVariable> *rhs)

{
  shared_ptr<libcellml::AnalyserExternalVariable> *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  testing *in_R8;
  AssertionResult AVar1;
  string local_60;
  string local_40;
  
  PrintToString<std::shared_ptr<libcellml::AnalyserExternalVariable>>(&local_40,(testing *)rhs,lhs);
  PrintToString<std::shared_ptr<libcellml::AnalyserExternalVariable>>(&local_60,in_R8,value);
  testing::internal::EqFailure
            (lhs_expression,rhs_expression,(string *)lhs,(string *)&local_40,SUB81(&local_60,0));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = lhs_expression;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}